

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O3

void __thiscall QPrintPreviewDialogPrivate::_q_zoomFactorChanged(QPrintPreviewDialogPrivate *this)

{
  QComboBox *pQVar1;
  bool *pbVar2;
  QPrintPreviewDialogPrivate *this_00;
  long in_FS_OFFSET;
  float fVar3;
  double value;
  bool ok;
  QString local_58;
  undefined1 local_39;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  QComboBox::lineEdit();
  QLineEdit::text();
  this_00 = (QPrintPreviewDialogPrivate *)&local_39;
  local_39 = (QDialogPrivate)0xaa;
  pbVar2 = (bool *)QString::remove((QChar)(char16_t)&local_38,0x25);
  fVar3 = (float)QString::toFloat(pbVar2);
  if (local_39 == (QDialogPrivate)0x1) {
    value = 1000.0;
    if ((double)fVar3 <= 1000.0) {
      value = (double)fVar3;
    }
    if (value <= 1.0) {
      value = 1.0;
    }
    QPrintPreviewWidget::setZoomFactor((QPrintPreviewWidget *)this->preview,value / 100.0);
    pQVar1 = this->zoomFactor;
    formattedZoomFactor(&local_58,this_00,value);
    QComboBox::setEditText((QString *)pQVar1);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    setFitting(this,false);
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::_q_zoomFactorChanged()
{
    QString text = zoomFactor->lineEdit()->text();
    bool ok;
    qreal factor = text.remove(u'%').toFloat(&ok);
    factor = qMax(qreal(1.0), qMin(qreal(1000.0), factor));
    if (ok) {
        preview->setZoomFactor(factor/100.0);
        zoomFactor->setEditText(formattedZoomFactor(factor));
        setFitting(false);
    }
}